

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

int STRING_replace(STRING_HANDLE handle,char target,char replace)

{
  STRING *pSVar1;
  STRING *str_value;
  size_t index;
  size_t length;
  int result;
  char replace_local;
  char target_local;
  STRING_HANDLE handle_local;
  
  if (handle == (STRING_HANDLE)0x0) {
    length._0_4_ = 0x367;
  }
  else {
    if (target != replace) {
      pSVar1 = (STRING *)strlen(handle->s);
      for (str_value = (STRING *)0x0; str_value < pSVar1;
          str_value = (STRING *)((long)&str_value->s + 1)) {
        if (handle->s[(long)str_value] == target) {
          handle->s[(long)str_value] = replace;
        }
      }
    }
    length._0_4_ = 0;
  }
  return (int)length;
}

Assistant:

int STRING_replace(STRING_HANDLE handle, char target, char replace)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_STRING_07_046: [ If handle is NULL STRING_replace shall return a non-zero value. ] */
        result = MU_FAILURE;
    }
    else if (target == replace)
    {
        /* Codes_SRS_STRING_07_048: [ If target and replace are equal STRING_replace, shall do nothing shall return zero. ] */
        result = 0;
    }
    else
    {
        size_t length;
        size_t index;
        /* Codes_SRS_STRING_07_047: [ STRING_replace shall replace all instances of target with replace. ] */
        STRING* str_value = (STRING*)handle;
        length = strlen(str_value->s);
        for (index = 0; index < length; index++)
        {
            if (str_value->s[index] == target)
            {
                str_value->s[index] = replace;
            }
        }
        /* Codes_SRS_STRING_07_049: [ On success STRING_replace shall return zero. ] */
        result = 0;
    }
    return result;
}